

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::Own<kj::AppendableFile>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryAppendFile
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  bool bVar1;
  size_t sVar2;
  Impl *this_00;
  String *pSVar3;
  Own<const_kj::Directory> *pOVar4;
  Directory *pDVar5;
  undefined4 in_register_0000000c;
  AppendableFile *extraout_RDX;
  AppendableFile *extraout_RDX_00;
  AppendableFile *extraout_RDX_01;
  AppendableFile *extraout_RDX_02;
  AppendableFile *extraout_RDX_03;
  AppendableFile *pAVar6;
  WriteMode in_R8D;
  PathPtr PVar7;
  Maybe<kj::Own<kj::AppendableFile>_> MVar8;
  StringPtr name;
  StringPtr local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  OwnOwn<const_kj::Directory> child;
  undefined1 local_90 [48];
  EntryImpl *entry;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault f_1;
  Fault local_38;
  Fault f;
  WriteMode mode_local;
  InMemoryDirectory *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)CONCAT44(in_register_0000000c,mode);
  this_local = (InMemoryDirectory *)path.parts.size_;
  name.content.ptr = (Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)path.parts.ptr;
  f.exception._4_4_ = in_R8D;
  path_local.parts.size_ = (size_t)this;
  sVar2 = PathPtr::size((PathPtr *)&this_local);
  if (sVar2 == 0) {
    bVar1 = has<kj::WriteMode,void>(f.exception._4_4_,MODIFY);
    if (bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4b9,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
      Maybe<kj::Own<kj::AppendableFile>_>::Maybe
                ((Maybe<kj::Own<kj::AppendableFile>_> *)this,(void *)0x0);
      kj::_::Debug::Fault::~Fault(&local_38);
      pAVar6 = extraout_RDX;
    }
    else {
      bVar1 = has<kj::WriteMode,void>(f.exception._4_4_,CREATE);
      if (bVar1) {
        Maybe<kj::Own<kj::AppendableFile>_>::Maybe
                  ((Maybe<kj::Own<kj::AppendableFile>_> *)this,(void *)0x0);
        pAVar6 = extraout_RDX_00;
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                  ((Fault *)&lock.ptr,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x4bd,FAILED,(char *)0x0,"\"can\'t replace self\"",
                   (char (*) [19])"can\'t replace self");
        Maybe<kj::Own<kj::AppendableFile>_>::Maybe
                  ((Maybe<kj::Own<kj::AppendableFile>_> *)this,(void *)0x0);
        kj::_::Debug::Fault::~Fault((Fault *)&lock.ptr);
        pAVar6 = extraout_RDX_01;
      }
    }
  }
  else {
    sVar2 = PathPtr::size((PathPtr *)&this_local);
    if (sVar2 == 1) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
      this_00 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                          ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
      pSVar3 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)(local_90 + 0x10),pSVar3);
      local_90._32_8_ = Impl::openEntry(this_00,(StringPtr)local_90._16_16_,f.exception._4_4_);
      local_90._40_8_ =
           kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                     ((Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)
                      (local_90 + 0x20));
      if ((EntryImpl *)local_90._40_8_ == (EntryImpl *)0x0) {
        Maybe<kj::Own<kj::AppendableFile>_>::Maybe
                  ((Maybe<kj::Own<kj::AppendableFile>_> *)this,(void *)0x0);
      }
      else {
        asFile((InMemoryDirectory *)local_90,name.content.ptr,(EntryImpl *)&entry,
               (WriteMode)local_90._40_8_);
        Maybe<kj::Own<const_kj::File>_>::
        map<kj::Own<kj::AppendableFile>_(&)(kj::Own<const_kj::File>)>
                  ((Maybe<kj::Own<const_kj::File>_> *)this,
                   (_func_Own<kj::AppendableFile>_Own<const_kj::File> *)local_90);
        Maybe<kj::Own<const_kj::File>_>::~Maybe((Maybe<kj::Own<const_kj::File>_> *)local_90);
      }
      child.value.ptr._4_4_ = 1;
      Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
      pAVar6 = extraout_RDX_02;
    }
    else {
      pSVar3 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr(&local_c8,pSVar3);
      name.content.size_ = (size_t)local_c8.content.ptr;
      tryGetParent((InMemoryDirectory *)local_b8,name,(WriteMode)local_c8.content.size_);
      kj::_::readMaybe<kj::Directory_const>
                ((_ *)local_a8,(Maybe<kj::Own<const_kj::Directory>_> *)local_b8);
      Maybe<kj::Own<const_kj::Directory>_>::~Maybe((Maybe<kj::Own<const_kj::Directory>_> *)local_b8)
      ;
      pOVar4 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_a8);
      if (pOVar4 == (Own<const_kj::Directory> *)0x0) {
        Maybe<kj::Own<kj::AppendableFile>_>::Maybe
                  ((Maybe<kj::Own<kj::AppendableFile>_> *)this,(void *)0x0);
      }
      else {
        pOVar4 = kj::_::OwnOwn<const_kj::Directory>::operator->
                           ((OwnOwn<const_kj::Directory> *)local_a8);
        pDVar5 = Own<const_kj::Directory>::get(pOVar4);
        sVar2 = PathPtr::size((PathPtr *)&this_local);
        PVar7 = PathPtr::slice((PathPtr *)&this_local,1,sVar2);
        (*(pDVar5->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x10])
                  (this,pDVar5,PVar7.parts.ptr,PVar7.parts.size_,(ulong)f.exception._4_4_);
      }
      child.value.ptr._4_4_ = 1;
      kj::_::OwnOwn<const_kj::Directory>::~OwnOwn((OwnOwn<const_kj::Directory> *)local_a8);
      pAVar6 = extraout_RDX_03;
    }
  }
  MVar8.ptr.ptr = pAVar6;
  MVar8.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::AppendableFile>_>)MVar8.ptr;
}

Assistant:

Maybe<Own<AppendableFile>> tryAppendFile(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        KJ_FAIL_REQUIRE("not a file") { return nullptr; }
      } else if (has(mode, WriteMode::CREATE)) {
        return nullptr;  // already exists (as a directory)
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return nullptr; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(path[0], mode)) {
        return asFile(lock, *entry, mode).map(newFileAppender);
      } else {
        return nullptr;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->tryAppendFile(path.slice(1, path.size()), mode);
      } else {
        return nullptr;
      }
    }
  }